

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O0

void __thiscall CHeap::Clear(CHeap *this)

{
  long *in_RDI;
  CChunk *pNext;
  CChunk *pChunk;
  undefined8 local_10;
  
  local_10 = *in_RDI;
  while (local_10 != 0) {
    local_10 = *(long *)(local_10 + 0x18);
    mem_free((void *)0x150abf);
  }
  *in_RDI = 0;
  return;
}

Assistant:

void CHeap::Clear()
{
	CChunk *pChunk = m_pCurrent;

	while(pChunk)
	{
		CChunk *pNext = pChunk->m_pNext;
		mem_free(pChunk);
		pChunk = pNext;
	}

	m_pCurrent = 0x0;
}